

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.h
# Opt level: O2

cell_map * next_generation(cell_map *__return_storage_ptr__,cell_map *cm)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  pointer puVar4;
  int y;
  int y_00;
  
  cell_map::cell_map(__return_storage_ptr__,cm);
  puVar4 = (cm->cells).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (y_00 = 0; y_00 < cm->height; y_00 = y_00 + 1) {
    iVar2 = cm->width;
    for (lVar3 = 0; iVar2 != lVar3; lVar3 = lVar3 + 1) {
      bVar1 = puVar4[lVar3];
      if (bVar1 != 0) {
        if ((bVar1 & 1) == 0) {
          if (bVar1 >> 1 == 3) {
            cell_map::set_cell(__return_storage_ptr__,(int)lVar3,y_00);
          }
        }
        else if ((byte)((bVar1 >> 1) - 4) < 0xfe) {
          cell_map::clear_cell(__return_storage_ptr__,(int)lVar3,y_00);
        }
      }
    }
    puVar4 = puVar4 + iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

inline cell_map next_generation(const cell_map& cm)
  {
  cell_map next(cm);
  auto it = cm.cells.begin();
  for (int y = 0; y < cm.height; ++y)
    {
    int x = 0;
    auto it_row_end = it + cm.width;
    while (it != it_row_end)
      {
      if (*it)
        {
        uint8_t count = *it >> 1;
        if (*it & 1)
          {
          // Cell is on; turn it off if it doesn't have
          // 2 or 3 neighbors
          if ((count != 2) && (count != 3))
            next.clear_cell(x, y);
          }
        else
          {
          // Cell is off; turn it on if it has exactly 3 neighbors
          if (count == 3)
            next.set_cell(x, y);
          }
        }
      ++it;
      ++x;
      }
    }
  return next;
  }